

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sleeplock.cpp
# Opt level: O1

bool __thiscall
ON_SleepLock::GetLock
          (ON_SleepLock *this,uint interval_wait_msecs,uint max_wait_msecs,
          bool bStealLockAfterWaiting)

{
  __atomic_flag_data_type _Var1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  int *piVar6;
  uint uVar7;
  ulong uVar8;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> __ns;
  long lVar9;
  ulong uVar10;
  __enable_if_is_duration<std::chrono::duration<long>_> __s;
  timespec local_40;
  
  bVar4 = true;
  LOCK();
  _Var1 = (this->m_lockedX).super___atomic_flag_base._M_i;
  (this->m_lockedX).super___atomic_flag_base._M_i = true;
  UNLOCK();
  if (_Var1 != false) {
    uVar10 = 0x32;
    if (interval_wait_msecs != 0) {
      uVar10 = (ulong)interval_wait_msecs;
    }
    uVar8 = uVar10 / 1000;
    lVar9 = (uVar10 % 1000) * 1000000;
    uVar2 = uVar8;
    lVar3 = lVar9;
LAB_005badbe:
    do {
      uVar7 = max_wait_msecs;
      local_40.tv_nsec = lVar3;
      local_40.tv_sec = uVar2;
      iVar5 = nanosleep(&local_40,&local_40);
      if (iVar5 == -1) {
        piVar6 = __errno_location();
        uVar2 = local_40.tv_sec;
        lVar3 = local_40.tv_nsec;
        max_wait_msecs = uVar7;
        if (*piVar6 == 4) goto LAB_005badbe;
      }
      LOCK();
      _Var1 = (this->m_lockedX).super___atomic_flag_base._M_i;
      (this->m_lockedX).super___atomic_flag_base._M_i = true;
      UNLOCK();
      if (_Var1 == false) {
        return true;
      }
      uVar2 = uVar8;
      lVar3 = lVar9;
      max_wait_msecs = 0;
    } while ((uVar7 == 0) ||
            (max_wait_msecs = uVar7 - (uint)uVar10, (uint)uVar10 <= uVar7 && max_wait_msecs != 0));
    if (bStealLockAfterWaiting) {
      ON_WarningEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_sleeplock.cpp"
                   ,0x9b,"","Stealing a resource lock.");
      bVar4 = true;
      LOCK();
      (this->m_lockedX).super___atomic_flag_base._M_i = true;
      UNLOCK();
    }
    else {
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool ON_SleepLock::GetLock( 
  unsigned int interval_wait_msecs,
  unsigned int max_wait_msecs,
  bool bStealLockAfterWaiting
  )
{
  // int locked = ON_IntSleepLock_Test(m_locked,0,1)
  // performs the following test and assignment in
  // an atomic operation.
  //
  // int locked = m_locked;
  // if ( 0 == locked )
  //   m_locked = 1;
  if ( GetLockOrReturnFalse() )
    return true; // acquired lock

  if ( interval_wait_msecs <= 0 )
    interval_wait_msecs = ON_SleepLock::DefaultWaitInterval;

  for(;;)
  {
    // Something else currently has this lock.

    // ON_PointerSleepLock_SuspendThisThread() suspends the thread
    // (not the process) for the specified number of milliseconds.
#if defined(ON_SLEEPLOCK_USES_STD_ATOMIC_FLAG)
    std::this_thread::sleep_for(std::chrono::milliseconds(interval_wait_msecs));
#else
    // Windows - sleep the thread (not the process)
    ::Sleep(interval_wait_msecs);
#endif

    // locked = ON_IntSleepLock_Test(m_locked,0,1)
    // performs the following test and assignment in
    // an atomic operation.
    //
    // locked = m_locked;
    // if ( 0 == locked )
    //   m_locked = 1;
    if ( GetLockOrReturnFalse() )
      return true; // acquired lock
    
    if ( max_wait_msecs > 0 )
    {
      if ( interval_wait_msecs >= max_wait_msecs )
      {
        if (bStealLockAfterWaiting)
        {
          // If the caller set max_wait_msecs to a value that is too small, 
          // has a bug in their code, then this is a bad idea, 
          // but it's also their own fault.
          //
          // If the resource is locked because another thread locked it and 
          // then forgot to unlock it or terminated before it could be unlocked,
          // then this is a good thing because it gets this thread unblocked 
          // and back in business.
          //
          ON_WARNING("Stealing a resource lock.");
          GetLockOrReturnFalse();
          return true;
        }

        // Give up and return false.
        break;
      }
      max_wait_msecs -= interval_wait_msecs;
    }
  }

  return false;  
}